

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_38e3a9::Db::parseOperatorName(Db *this,NameState *State)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  ConversionOperatorType *pCVar5;
  Node *pNVar6;
  Node *pNVar7;
  NameType *pNVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  Node *Ty;
  
  pbVar4 = (byte *)this->First;
  uVar9 = (long)this->Last - (long)pbVar4;
  if ((byte *)this->Last == pbVar4) {
    return (Node *)0x0;
  }
  uVar10 = *pbVar4 - 0x61;
  if (0x15 < uVar10) {
    return (Node *)0x0;
  }
  uVar10 = (&switchD_0019a370::switchdataD_001b6c60)[uVar10];
  switch((uint)*pbVar4) {
  case 0x61:
    if (1 < uVar9) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x4e) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator&=";
        goto LAB_0019aa76;
      }
      if (bVar1 == 0x53) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator=";
      }
      else {
        if ((bVar1 != 0x6e) && (bVar1 != 100)) {
          if (bVar1 != 0x61) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator&&";
          goto LAB_0019aa76;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator&";
      }
      goto LAB_0019a9f6;
    }
    break;
  case 99:
    if (uVar9 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 == 0x76) {
      this->First = (char *)(pbVar4 + 2);
      bVar2 = this->TryToParseTemplateArgs;
      bVar3 = this->PermitForwardTemplateReferences;
      this->TryToParseTemplateArgs = false;
      this->PermitForwardTemplateReferences = (bool)(State != (NameState *)0x0 | bVar3);
      Ty = parseType(this);
      if (Ty == (Node *)0x0) {
        pCVar5 = (ConversionOperatorType *)0x0;
      }
      else {
        if (State != (NameState *)0x0) {
          State->CtorDtorConversion = true;
        }
        pCVar5 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::ConversionOperatorType,(anonymous_namespace)::Node*&>
                           ((Db *)this,&Ty);
      }
      this->PermitForwardTemplateReferences = bVar3;
      this->TryToParseTemplateArgs = bVar2;
      return &pCVar5->super_Node;
    }
    if (bVar1 == 0x6d) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator,";
    }
    else {
      if (bVar1 != 0x6f) {
        if (bVar1 != 0x6c) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator()";
        goto LAB_0019aa76;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator~";
    }
    goto LAB_0019a9f6;
  case 100:
    if (uVar9 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 == 0x56) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator/=";
      goto LAB_0019aa76;
    }
    if (bVar1 == 0x76) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator/";
      goto LAB_0019a9f6;
    }
    if (bVar1 != 0x65) {
      if (bVar1 == 0x6c) {
        this->First = (char *)(pbVar4 + 2);
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar6->K = KNameType;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f76d0;
        pNVar6[1]._vptr_Node = (_func_int **)"operator delete";
        *(char **)&pNVar6[1].K = "";
        return pNVar6;
      }
      if (bVar1 != 0x61) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[18]>
                         ((Db *)this,(char (*) [18])"operator delete[]");
      return &pNVar8->super_Node;
    }
    goto LAB_0019a72f;
  case 0x65:
    if (1 < uVar9) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x4f) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator^=";
      }
      else {
        if (bVar1 != 0x71) {
          if (bVar1 != 0x6f) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator^";
          goto LAB_0019a9f6;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator==";
      }
      goto LAB_0019aa76;
    }
    break;
  case 0x67:
    if (1 < uVar9) {
      if (pbVar4[1] == 0x74) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator>";
        goto LAB_0019a9f6;
      }
      if (pbVar4[1] == 0x65) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator>=";
        goto LAB_0019aa76;
      }
    }
    break;
  case 0x69:
    if ((1 < uVar9) && (pbVar4[1] == 0x78)) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator[]";
      goto LAB_0019aa76;
    }
    break;
  case 0x6c:
    if (1 < uVar9) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x53) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator<<=";
        goto LAB_0019aa56;
      }
      if (bVar1 == 0x74) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator<";
        goto LAB_0019a9f6;
      }
      if (bVar1 != 0x69) {
        if (bVar1 == 0x73) {
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator<<";
        }
        else {
          if (bVar1 != 0x65) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator<=";
        }
        goto LAB_0019aa76;
      }
      this->First = (char *)(pbVar4 + 2);
      pNVar6 = parseSourceName(this,(NameState *)
                                    ((long)&switchD_0019a370::switchdataD_001b6c60 +
                                    (long)(int)uVar10));
      if (pNVar6 != (Node *)0x0) {
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
        pNVar7->K = KLiteralOperator;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f7e08;
        pNVar7[1]._vptr_Node = (_func_int **)pNVar6;
        return pNVar7;
      }
    }
    break;
  case 0x6d:
    if (uVar9 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 == 0x49) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator-=";
LAB_0019aa76:
      pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                         ((Db *)this,(char (*) [11])pcVar11);
      return &pNVar8->super_Node;
    }
    if (bVar1 == 0x4c) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator*=";
      goto LAB_0019aa76;
    }
    if (bVar1 == 0x6d) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator--";
      goto LAB_0019aa76;
    }
    if (bVar1 != 0x6c) {
      if (bVar1 != 0x69) {
        return (Node *)0x0;
      }
      goto LAB_0019a768;
    }
LAB_0019a72f:
    this->First = (char *)(pbVar4 + 2);
    pcVar11 = "operator*";
LAB_0019a9f6:
    pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                       ((Db *)this,(char (*) [10])pcVar11);
    return &pNVar8->super_Node;
  case 0x6e:
    if (uVar9 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 == 0x77) {
      this->First = (char *)(pbVar4 + 2);
      pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[13]>
                         ((Db *)this,(char (*) [13])"operator new");
      return &pNVar8->super_Node;
    }
    if (bVar1 == 0x65) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator!=";
      goto LAB_0019aa76;
    }
    if (bVar1 != 0x67) {
      if (bVar1 != 0x74) {
        if (bVar1 != 0x61) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                           ((Db *)this,(char (*) [15])"operator new[]");
        return &pNVar8->super_Node;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator!";
      goto LAB_0019a9f6;
    }
LAB_0019a768:
    this->First = (char *)(pbVar4 + 2);
    pcVar11 = "operator-";
    goto LAB_0019a9f6;
  case 0x6f:
    if (1 < uVar9) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x52) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator|=";
      }
      else {
        if (bVar1 == 0x72) {
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator|";
          goto LAB_0019a9f6;
        }
        if (bVar1 != 0x6f) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator||";
      }
      goto LAB_0019aa76;
    }
    break;
  case 0x70:
    if (1 < uVar9) {
      switch(pbVar4[1]) {
      case 0x6c:
      case 0x73:
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator+";
        goto LAB_0019a9f6;
      case 0x6d:
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator->*";
        goto LAB_0019aa56;
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x72:
        return (Node *)0x0;
      case 0x70:
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator++";
        break;
      case 0x74:
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator->";
        break;
      default:
        if (pbVar4[1] != 0x4c) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator+=";
      }
      goto LAB_0019aa76;
    }
    break;
  case 0x71:
    if ((1 < uVar9) && (pbVar4[1] == 0x75)) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator?";
      goto LAB_0019a9f6;
    }
    break;
  case 0x72:
    if (1 < uVar9) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x4d) {
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator%=";
      }
      else {
        if (bVar1 == 0x53) {
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator>>=";
          goto LAB_0019aa56;
        }
        if (bVar1 != 0x73) {
          if (bVar1 != 0x6d) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar11 = "operator%";
          goto LAB_0019a9f6;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar11 = "operator>>";
      }
      goto LAB_0019aa76;
    }
    break;
  case 0x73:
    if ((1 < uVar9) && (pbVar4[1] == 0x73)) {
      this->First = (char *)(pbVar4 + 2);
      pcVar11 = "operator<=>";
LAB_0019aa56:
      pNVar8 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[12]>
                         ((Db *)this,(char (*) [12])pcVar11);
      return &pNVar8->super_Node;
    }
    break;
  case 0x76:
    if ((1 < uVar9) && ((int)(char)pbVar4[1] - 0x30U < 10)) {
      this->First = (char *)(pbVar4 + 2);
      Ty = parseSourceName(this,(NameState *)
                                ((long)&switchD_0019a370::switchdataD_001b6c60 + (long)(int)uVar10))
      ;
      if (Ty != (Node *)0x0) {
        pCVar5 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::ConversionOperatorType,(anonymous_namespace)::Node*&>
                           ((Db *)this,&Ty);
        return &pCVar5->super_Node;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

char look(unsigned Lookahead = 0) {
    if (static_cast<size_t>(Last - First) <= Lookahead)
      return '\0';
    return First[Lookahead];
  }